

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall lzham::lzcompressor::state::state(state *this)

{
  long lVar1;
  raw_quasi_adaptive_huffman_data_model *prVar2;
  
  lVar1 = 0x1c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x61c);
  lVar1 = 0x61c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x634);
  lVar1 = 0x634;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x64c);
  lVar1 = 0x64c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x664);
  lVar1 = 0x664;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x67c);
  lVar1 = 0x67c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x694);
  prVar2 = &this->m_lit_table[0].super_raw_quasi_adaptive_huffman_data_model;
  lVar1 = 0;
  do {
    raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
              (prVar2,true,0,false,false);
    lVar1 = lVar1 + -0x80;
    prVar2 = (raw_quasi_adaptive_huffman_data_model *)&prVar2[1].m_pDecode_tables;
  } while (lVar1 != -0x2000);
  prVar2 = &this->m_delta_lit_table[0].super_raw_quasi_adaptive_huffman_data_model;
  lVar1 = 0;
  do {
    raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
              (prVar2,true,0,false,false);
    lVar1 = lVar1 + -0x80;
    prVar2 = (raw_quasi_adaptive_huffman_data_model *)&prVar2[1].m_pDecode_tables;
  } while (lVar1 != -0x2000);
  raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
            (&(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model,true,0,false,false);
  prVar2 = &this->m_rep_len_table[0].super_raw_quasi_adaptive_huffman_data_model;
  lVar1 = 0;
  do {
    raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
              (prVar2,true,0,false,false);
    lVar1 = lVar1 + -0x80;
    prVar2 = (raw_quasi_adaptive_huffman_data_model *)&prVar2[1].m_pDecode_tables;
  } while (lVar1 != -0x100);
  prVar2 = &this->m_large_len_table[0].super_raw_quasi_adaptive_huffman_data_model;
  lVar1 = 0;
  do {
    raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
              (prVar2,true,0,false,false);
    lVar1 = lVar1 + -0x80;
    prVar2 = (raw_quasi_adaptive_huffman_data_model *)&prVar2[1].m_pDecode_tables;
  } while (lVar1 != -0x100);
  raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
            (&(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model,true,0,false,
             false);
  clear(this);
  return;
}

Assistant:

lzcompressor::state::state()
   {
      clear();
   }